

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O1

int __thiscall
deqp::gls::BufferTestUtil::VertexArrayVerifier::verify
          (VertexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  long *plVar1;
  GLuint program;
  RenderContext *context;
  long lVar2;
  ulong uVar3;
  uchar *puVar4;
  bool bVar5;
  int i_4;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined8 *puVar9;
  TextureFormat *pTVar10;
  RGBA *pRVar11;
  TextureFormat TVar12;
  RGBA *pRVar13;
  unsigned_short uVar14;
  uint uVar15;
  int x;
  byte bVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  void *pvVar25;
  int y;
  CallLogWrapper *this_00;
  long lVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  Vec4 v00;
  Vec4 v01;
  Vec4 color;
  Vec4 v10;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  Vec4 v11;
  string imageSetDesc;
  RGBA threshold;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Surface reference;
  Surface rendered;
  Vector<float,_4> res;
  PixelBufferAccess dstAccess;
  uint local_3bc;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  ulong local_3a8;
  TextureFormat TStack_3a0;
  uint local_394;
  ulong local_390;
  undefined8 local_388;
  long local_380;
  ulong local_378 [2];
  Vec4 local_368;
  ulong local_358 [2];
  undefined8 local_348;
  undefined8 local_340;
  long local_338;
  undefined8 uStack_330;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_328;
  RGBA local_308;
  undefined4 uStack_304;
  long local_300;
  ulong local_2f8 [2];
  long *local_2e8;
  undefined8 local_2e0;
  long local_2d8;
  undefined8 uStack_2d0;
  ulong local_2c8;
  uint local_2c0;
  uint local_2bc;
  int local_2b8;
  uint local_2b4;
  int local_2b0;
  RGBA local_2ac;
  undefined1 local_2a8 [16];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_298;
  undefined1 local_278 [16];
  uchar *local_268;
  size_t local_260;
  uchar *local_258;
  ulong local_250;
  Surface local_248;
  Surface local_230;
  CallLogWrapper *local_218;
  ulong local_210;
  uchar *local_208;
  ulong local_200;
  float local_1f8 [20];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  int *piVar8;
  
  local_268 = sig;
  local_260 = siglen;
  local_258 = tbs;
  iVar6 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[4])();
  piVar8 = (int *)CONCAT44(extraout_var,iVar6);
  iVar6 = *piVar8;
  iVar18 = iVar6 + 7;
  if (-1 < iVar6) {
    iVar18 = iVar6;
  }
  iVar20 = piVar8[1];
  uVar15 = iVar18 >> 3;
  if (0x7f < iVar18 >> 3) {
    uVar15 = 0x80;
  }
  local_390 = (ulong)uVar15;
  iVar18 = iVar20 + 7;
  if (-1 < iVar20) {
    iVar18 = iVar20;
  }
  uVar15 = iVar18 >> 3;
  if (0x7f < iVar18 >> 3) {
    uVar15 = 0x80;
  }
  bVar16 = 8 - (char)piVar8[2];
  uVar7 = 0x1000000 << (8U - (char)piVar8[5] & 0x1f);
  if (piVar8[5] < 1) {
    uVar7 = 0;
  }
  uVar24 = 0x100 << (8U - (char)piVar8[3] & 0x1f) | 1 << (bVar16 & 0x1f);
  uVar7 = 0x10000 << (8U - (char)piVar8[4] & 0x1f) | uVar24 | uVar7;
  uVar21 = 1 << (bVar16 & 0x1f) & 0xff;
  if (0xfb < uVar21) {
    uVar21 = 0xfc;
  }
  program = (this->m_program->m_program).m_program;
  uVar24 = uVar24 >> 8 & 0xff;
  if (0xfb < uVar24) {
    uVar24 = 0xfc;
  }
  uVar17 = uVar7 >> 0x10 & 0xff;
  if (0xfb < uVar17) {
    uVar17 = 0xfc;
  }
  uVar7 = uVar7 >> 0x18;
  if (0xfb < uVar7) {
    uVar7 = 0xfc;
  }
  local_2ac.m_value = uVar7 * 0x1000000 + (uVar17 << 0x10 | uVar24 << 8 | uVar21) + 0x3030303;
  local_328.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tcu::Surface::Surface(&local_230);
  local_2a8._0_4_ = (int)ctx;
  tcu::Surface::Surface(&local_248);
  uVar7 = uVar15 * (int)local_390;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_328,(long)(int)(uVar7 * 4));
  if (7 < iVar20) {
    fVar27 = (float)(int)local_390;
    uVar21 = 0;
    iVar18 = 3;
    do {
      if (7 < iVar6) {
        fVar28 = (float)(int)uVar21 / (float)(int)uVar15;
        fVar29 = (float)(int)(uVar21 + 1) / (float)(int)uVar15;
        fVar28 = fVar28 + fVar28 + -1.0;
        fVar29 = fVar29 + fVar29 + -1.0;
        uVar23 = 0;
        iVar20 = iVar18;
        do {
          iVar22 = (int)uVar23;
          uVar23 = uVar23 + 1;
          fVar30 = (float)iVar22 / fVar27;
          fVar31 = (float)(int)uVar23 / fVar27;
          fVar30 = fVar30 + fVar30 + -1.0;
          fVar31 = fVar31 + fVar31 + -1.0;
          local_328.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar20 + -3].m_data[0] = fVar30;
          local_328.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar20 + -3].m_data[1] = fVar28;
          local_328.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar20 + -2].m_data[0] = fVar30;
          local_328.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar20 + -2].m_data[1] = fVar29;
          local_328.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar20 + -1].m_data[0] = fVar31;
          local_328.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar20 + -1].m_data[1] = fVar28;
          local_328.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar20].m_data[0] = fVar31;
          local_328.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar20].m_data[1] = fVar29;
          iVar20 = iVar20 + 4;
        } while ((local_390 & 0xffffffff) != uVar23);
      }
      uVar21 = uVar21 + 1;
      iVar18 = iVar18 + (int)local_390 * 4;
    } while (uVar21 != uVar15);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&local_298,(long)(int)(uVar7 * 6));
  if (0 < (int)uVar7) {
    uVar14 = 3;
    lVar19 = 0;
    do {
      iVar6 = (int)lVar19;
      local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6] = uVar14 - 1;
      local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6 + 1] = uVar14 - 3;
      local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6 + 2] = uVar14 - 2;
      local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6 + 3] = uVar14 - 1;
      local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6 + 4] = uVar14 - 2;
      local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6 + 5] = uVar14;
      lVar19 = lVar19 + 6;
      uVar14 = uVar14 + 4;
    } while ((ulong)uVar7 * 6 != lVar19);
  }
  this_00 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x88eb,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,(int)local_390 * 8,uVar15 << 3);
  glu::CallLogWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_positionBuf);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8892,
             (long)local_328.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_328.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             local_328.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_posLoc);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,this->m_posLoc,2,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_indexBuf);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8893,
             (long)local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_byteVecLoc);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,local_2a8._0_4_);
  local_2bc = uVar7 * 0xc;
  local_2c0 = (int)local_258 - 0xc;
  local_268 = local_268 + (int)local_260;
  local_3bc = (uint)CONCAT71((int7)(int3)(local_260 >> 8),1);
  uVar15 = 0;
  local_218 = this_00;
  do {
    uVar7 = (int)local_258 - uVar15;
    if (uVar7 == 0 || (int)local_258 < (int)uVar15) break;
    uVar23 = 0xc;
    local_394 = uVar7;
    local_278._0_4_ = local_2c0;
    if (0xb < (int)uVar7) {
      local_394 = (uVar7 / 0xc) * 0xc;
      if (SBORROW4(local_2bc,local_394) != (int)(local_2bc + (uVar7 / 0xc) * -0xc) < 0) {
        local_394 = local_2bc;
      }
      uVar23 = (ulong)local_394;
      local_278._0_4_ = uVar15;
    }
    local_278._4_4_ = 0;
    local_2a8._0_8_ = uVar23;
    uVar7 = (int)uVar23 / 0xc;
    iVar6 = (int)local_390;
    local_250 = (ulong)uVar7;
    if (iVar6 < (int)uVar7) {
      local_250 = local_390 & 0xffffffff;
    }
    local_2b0 = ((int)uVar7 / iVar6 + 1) - (uint)((int)uVar7 % iVar6 == 0);
    local_388 = local_378;
    local_2b4 = uVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Bytes ","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar6 = local_278._0_4_ + (int)local_260;
    std::ostream::operator<<(local_1a8,iVar6);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar23 = 0xf;
    if (local_388 != local_378) {
      uVar23 = local_378[0];
    }
    if (uVar23 < (ulong)(local_300 + local_380)) {
      uVar23 = 0xf;
      if ((ulong *)CONCAT44(uStack_304,local_308.m_value) != local_2f8) {
        uVar23 = local_2f8[0];
      }
      if (uVar23 < (ulong)(local_300 + local_380)) goto LAB_018c01e4;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_388);
    }
    else {
LAB_018c01e4:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_388,CONCAT44(uStack_304,local_308.m_value));
    }
    local_348 = &local_338;
    plVar1 = puVar9 + 2;
    if ((long *)*puVar9 == plVar1) {
      local_338 = *plVar1;
      uStack_330 = puVar9[3];
    }
    else {
      local_338 = *plVar1;
      local_348 = (long *)*puVar9;
    }
    local_340 = puVar9[1];
    *puVar9 = plVar1;
    puVar9[1] = 0;
    *(undefined1 *)plVar1 = 0;
    pTVar10 = (TextureFormat *)std::__cxx11::string::append((char *)&local_348);
    local_3b8 = (undefined1  [8])&local_3a8;
    TVar12 = (TextureFormat)(pTVar10 + 2);
    if (*pTVar10 == TVar12) {
      local_3a8 = *(ulong *)TVar12;
      TStack_3a0 = pTVar10[3];
    }
    else {
      local_3a8 = *(ulong *)TVar12;
      local_3b8 = (undefined1  [8])*pTVar10;
    }
    uStack_3b0 = pTVar10[1];
    *pTVar10 = TVar12;
    pTVar10[1].order = R;
    pTVar10[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar10[2].order = R;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar6 + local_2a8._0_4_ + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar23 = 0xf;
    if (local_3b8 != (undefined1  [8])&local_3a8) {
      uVar23 = local_3a8;
    }
    if (uVar23 < (ulong)(local_368.m_data._8_8_ + (long)uStack_3b0)) {
      uVar23 = 0xf;
      if ((ulong *)local_368.m_data._0_8_ != local_358) {
        uVar23 = local_358[0];
      }
      if (uVar23 < (ulong)(local_368.m_data._8_8_ + (long)uStack_3b0)) goto LAB_018c0351;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_3b8);
    }
    else {
LAB_018c0351:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append(local_3b8,local_368.m_data._0_8_);
    }
    local_2e8 = &local_2d8;
    plVar1 = puVar9 + 2;
    if ((long *)*puVar9 == plVar1) {
      local_2d8 = *plVar1;
      uStack_2d0 = puVar9[3];
    }
    else {
      local_2d8 = *plVar1;
      local_2e8 = (long *)*puVar9;
    }
    local_2e0 = puVar9[1];
    *puVar9 = plVar1;
    puVar9[1] = 0;
    *(undefined1 *)plVar1 = 0;
    if ((ulong *)local_368.m_data._0_8_ != local_358) {
      operator_delete((void *)local_368.m_data._0_8_,local_358[0] + 1);
    }
    if (local_3b8 != (undefined1  [8])&local_3a8) {
      operator_delete((void *)local_3b8,local_3a8 + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if ((ulong *)CONCAT44(uStack_304,local_308.m_value) != local_2f8) {
      operator_delete((ulong *)CONCAT44(uStack_304,local_308.m_value),local_2f8[0] + 1);
    }
    if (local_388 != local_378) {
      operator_delete(local_388,local_378[0] + 1);
    }
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,this->m_byteVecLoc,3,0x1401,'\x01',0,(void *)(long)iVar6);
    glu::CallLogWrapper::glDrawElements(this_00,4,uVar7 * 6,0x1403,(void *)0x0);
    iVar6 = (int)local_250;
    iVar18 = iVar6 * 8;
    tcu::Surface::setSize
              (&local_248,iVar18,(((int)uVar7 / iVar6 + 1) - (uint)((int)uVar7 % iVar6 == 0)) * 8);
    local_3b8._0_4_ = RGBA;
    local_3b8._4_4_ = UNORM_INT8;
    pvVar25 = (void *)local_248.m_pixels.m_cap;
    if ((void *)local_248.m_pixels.m_cap != (void *)0x0) {
      pvVar25 = local_248.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1a8,(TextureFormat *)local_3b8,local_248.m_width,
               local_248.m_height,1,pvVar25);
    local_3b8._0_4_ = R;
    local_3b8._4_4_ = SNORM_INT8;
    uStack_3b0._0_4_ = 0;
    uStack_3b0._4_4_ = 0xff;
    tcu::clear((PixelBufferAccess *)local_1a8,(IVec4 *)local_3b8);
    local_2b8 = iVar18;
    if (0xb < (int)local_2a8._0_4_) {
      local_208 = local_268 + (int)local_278._0_4_;
      local_210 = (ulong)uVar7;
      uVar23 = 0;
      do {
        puVar4 = local_208;
        lVar2 = (long)(int)local_250;
        uVar3 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
        local_2c8 = (long)uVar3 / lVar2 & 0xffffffff;
        lVar19 = (uVar23 << 0x22) + (uVar23 << 0x23);
        lVar26 = lVar19 >> 0x20;
        local_348 = (long *)(CONCAT44(local_348._4_4_,
                                      (uint)CONCAT12(local_208[lVar26 + 2],
                                                     *(undefined2 *)(local_208 + lVar26))) |
                            0xff000000);
        local_200 = uVar23;
        tcu::RGBA::toVec((RGBA *)local_3b8);
        local_388 = (ulong *)(CONCAT44(local_388._4_4_,
                                       (uint)CONCAT12(puVar4[lVar26 + 5],
                                                      *(undefined2 *)(puVar4 + lVar26 + 3))) |
                             0xff000000);
        tcu::RGBA::toVec((RGBA *)&local_348);
        lVar26 = lVar19 + 0x600000000 >> 0x20;
        local_308.m_value =
             CONCAT12(puVar4[lVar26 + 2],*(undefined2 *)(puVar4 + lVar26)) | 0xff000000;
        tcu::RGBA::toVec((RGBA *)&local_388);
        lVar19 = lVar19 + 0x900000000 >> 0x20;
        local_368.m_data._0_8_ =
             CONCAT44(local_368.m_data[1],
                      (uint)CONCAT12(puVar4[lVar19 + 2],*(undefined2 *)(puVar4 + lVar19))) |
             0xff000000;
        tcu::RGBA::toVec(&local_308);
        local_2c8 = (ulong)(uint)((int)local_2c8 << 3);
        iVar6 = 0;
        do {
          fVar27 = ((float)iVar6 + 0.5) * 0.125;
          local_2a8 = ZEXT416((uint)(1.0 - fVar27));
          iVar18 = (int)local_2c8;
          iVar20 = 0;
          local_278 = ZEXT416((uint)fVar27);
          do {
            fVar29 = ((float)iVar20 + 0.5) * 0.125;
            fVar28 = fVar27 + fVar29;
            pRVar11 = &local_308;
            if (fVar28 <= 1.0) {
              pRVar11 = (RGBA *)local_3b8;
            }
            pRVar13 = (RGBA *)&local_348;
            if (fVar28 <= 1.0) {
              pRVar13 = (RGBA *)&local_388;
            }
            local_1f8[8] = 0.0;
            local_1f8[9] = 0.0;
            local_1f8[10] = 0.0;
            local_1f8[0xb] = 0.0;
            lVar19 = 0;
            do {
              local_1f8[lVar19 + 8] =
                   (float)pRVar13[lVar19].m_value - (float)pRVar11[lVar19].m_value;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            local_1f8[0xc] = 0.0;
            local_1f8[0xd] = 0.0;
            local_1f8[0xe] = 0.0;
            local_1f8[0xf] = 0.0;
            lVar19 = 0;
            do {
              local_1f8[lVar19 + 0xc] =
                   local_1f8[lVar19 + 8] *
                   (float)(~-(uint)(fVar28 <= 1.0) & (uint)(1.0 - fVar29) |
                          (uint)fVar29 & -(uint)(fVar28 <= 1.0));
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            local_1f8[0x10] = 0.0;
            local_1f8[0x11] = 0.0;
            local_1f8[0x12] = 0.0;
            local_1f8[0x13] = 0.0;
            lVar19 = 0;
            do {
              local_1f8[lVar19 + 0x10] = (float)pRVar11[lVar19].m_value + local_1f8[lVar19 + 0xc];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            pRVar13 = (RGBA *)&local_388;
            if (fVar28 <= 1.0) {
              pRVar13 = (RGBA *)&local_348;
            }
            local_1f8[0] = 0.0;
            local_1f8[1] = 0.0;
            local_1f8[2] = 0.0;
            local_1f8[3] = 0.0;
            lVar19 = 0;
            do {
              local_1f8[lVar19] = (float)pRVar13[lVar19].m_value - (float)pRVar11[lVar19].m_value;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            local_1f8[4] = 0.0;
            local_1f8[5] = 0.0;
            local_1f8[6] = 0.0;
            local_1f8[7] = 0.0;
            lVar19 = 0;
            do {
              local_1f8[lVar19 + 4] =
                   local_1f8[lVar19] *
                   (float)(~-(uint)(fVar28 <= 1.0) & local_2a8._0_4_ |
                          -(uint)(fVar28 <= 1.0) & (uint)fVar27);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            local_368.m_data._0_8_ = (ulong *)0x0;
            local_368.m_data[2] = 0.0;
            local_368.m_data[3] = 0.0;
            lVar19 = 0;
            do {
              local_368.m_data[lVar19] = local_1f8[lVar19 + 0x10] + local_1f8[lVar19 + 4];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_1a8,&local_368,
                       (int)((long)uVar3 % lVar2) * 8 + iVar20,iVar18 + iVar6,0);
            iVar20 = iVar20 + 1;
            fVar27 = (float)local_278._0_4_;
          } while (iVar20 != 8);
          iVar6 = iVar6 + 1;
        } while (iVar6 != 8);
        uVar23 = local_200 + 1;
      } while (uVar23 != local_210);
    }
    tcu::Surface::setSize(&local_230,local_2b8,local_2b0 << 3);
    this_00 = local_218;
    context = (this->super_BufferVerifierBase).m_renderCtx;
    local_3b8._0_4_ = RGBA;
    local_3b8._4_4_ = UNORM_INT8;
    pvVar25 = (void *)local_230.m_pixels.m_cap;
    if ((void *)local_230.m_pixels.m_cap != (void *)0x0) {
      pvVar25 = local_230.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1a8,(TextureFormat *)local_3b8,local_230.m_width,
               local_230.m_height,1,pvVar25);
    glu::readPixels(context,0,0,(PixelBufferAccess *)local_1a8);
    bVar5 = tcu::pixelThresholdCompare
                      ((this->super_BufferVerifierBase).m_log,"RenderResult",(char *)local_2e8,
                       &local_248,&local_230,&local_2ac,COMPARE_LOG_RESULT);
    local_3bc = local_3bc & 0xff;
    uVar15 = local_394;
    if (!bVar5) {
      local_3bc = 0;
      uVar15 = 0;
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    uVar15 = local_2b4 + uVar15;
  } while (bVar5);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  tcu::Surface::~Surface(&local_248);
  tcu::Surface::~Surface(&local_230);
  if (local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_328.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_3bc;
}

Assistant:

bool VertexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_renderCtx.getRenderTarget();
	const int					numBytesInVtx		= 3;
	const int					numBytesInQuad		= numBytesInVtx*4;
	int							maxQuadsX			= de::min(128, renderTarget.getWidth()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsY			= de::min(128, renderTarget.getHeight()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsPerBatch	= maxQuadsX*maxQuadsY;
	int							numVerified			= 0;
	deUint32					program				= m_program->getProgram();
	tcu::RGBA					threshold			= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(3,3,3,3);
	bool						isOk				= true;

	vector<tcu::Vec2>			positions;
	vector<deUint16>			indices;

	tcu::Surface				rendered;
	tcu::Surface				reference;

	DE_ASSERT(numBytes >= numBytesInQuad); // Can't render full quad with smaller buffers.

	computePositions(positions, maxQuadsX, maxQuadsY);
	computeIndices(indices, maxQuadsX, maxQuadsY);

	// Reset buffer bindings.
	glBindBuffer				(GL_PIXEL_PACK_BUFFER, 0);

	// Setup rendering state.
	glViewport					(0, 0, maxQuadsX*VERIFY_QUAD_SIZE, maxQuadsY*VERIFY_QUAD_SIZE);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(program);
	glBindVertexArray			(m_vao);

	// Upload positions
	glBindBuffer				(GL_ARRAY_BUFFER, m_positionBuf);
	glBufferData				(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(positions.size()*sizeof(positions[0])), &positions[0], GL_STATIC_DRAW);
	glEnableVertexAttribArray	(m_posLoc);
	glVertexAttribPointer		(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

	// Upload indices
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER, m_indexBuf);
	glBufferData				(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indices.size()*sizeof(indices[0])), &indices[0], GL_STATIC_DRAW);

	glEnableVertexAttribArray	(m_byteVecLoc);
	glBindBuffer				(GL_ARRAY_BUFFER, buffer);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < numBytesInQuad;
		int		numBytesToVerify	= isLeftoverBatch ? numBytesInQuad				: de::min(maxQuadsPerBatch*numBytesInQuad, numRemaining - numRemaining%numBytesInQuad);
		int		curOffset			= isLeftoverBatch ? (numBytes-numBytesInQuad)	: numVerified;
		int		numQuads			= numBytesToVerify/numBytesInQuad;
		int		numCols				= de::min(maxQuadsX, numQuads);
		int		numRows				= numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0);
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		DE_ASSERT(numBytesToVerify > 0 && numBytesToVerify%numBytesInQuad == 0);
		DE_ASSERT(de::inBounds(curOffset, 0, numBytes));
		DE_ASSERT(de::inRange(curOffset+numBytesToVerify, curOffset, numBytes));

		// Render batch.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_byteVecLoc, 3, GL_UNSIGNED_BYTE, GL_TRUE, 0, (const glw::GLvoid*)(deUintptr)(offset + curOffset));
		glDrawElements			(GL_TRIANGLES, numQuads*6, GL_UNSIGNED_SHORT, DE_NULL);

		renderQuadGridReference(reference,  numQuads, numCols, refPtr + offset + curOffset);

		rendered.setSize(numCols*VERIFY_QUAD_SIZE, numRows*VERIFY_QUAD_SIZE);
		glu::readPixels(m_renderCtx, 0, 0, rendered.getAccess());

		if (!tcu::pixelThresholdCompare(m_log, "RenderResult", imageSetDesc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glBindVertexArray(0);

	return isOk;
}